

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha3.c
# Opt level: O1

void pp_crypto_hash_sha3_process(PHashSHA3 *ctx,puint64 *data)

{
  ulong *puVar1;
  uint uVar2;
  puint64 pVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  puint i;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong local_68 [5];
  ulong uStack_40;
  puint64 local_38;
  puint64 C [5];
  
  uVar2 = ctx->block_size;
  if (7 < uVar2) {
    uVar10 = 0;
    do {
      ctx->hash[uVar10] = ctx->hash[uVar10] ^ data[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar2 >> 3 != uVar10);
  }
  lVar9 = 0;
  do {
    lVar11 = 0;
    do {
      C[lVar11 + -1] =
           ctx->hash[lVar11 + 5] ^ ctx->hash[lVar11] ^ ctx->hash[lVar11 + 10] ^
           ctx->hash[lVar11 + 0xf] ^ ctx->hash[lVar11 + 0x14];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 5);
    lVar11 = -0x28;
    do {
      uVar10 = *(ulong *)((long)&uStack_40 + lVar11);
      puVar1 = (ulong *)((long)ctx->hash + lVar11 + 0x28);
      *puVar1 = *puVar1 ^ uVar10;
      puVar1 = (ulong *)((long)ctx->hash + lVar11 + 0x50);
      *puVar1 = *puVar1 ^ uVar10;
      puVar1 = (ulong *)((long)ctx->hash + lVar11 + 0x78);
      *puVar1 = *puVar1 ^ uVar10;
      puVar1 = (ulong *)((long)ctx->hash + lVar11 + 0xa0);
      *puVar1 = *puVar1 ^ uVar10;
      puVar1 = (ulong *)((long)&ctx->len + lVar11);
      *puVar1 = *puVar1 ^ uVar10;
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0);
    pVar3 = ctx->hash[1];
    ctx->hash[1] = ctx->hash[6] << 0x2c | ctx->hash[6] >> 0x14;
    ctx->hash[6] = ctx->hash[9] << 0x14 | ctx->hash[9] >> 0x2c;
    ctx->hash[9] = ctx->hash[0x16] << 0x3d | ctx->hash[0x16] >> 3;
    ctx->hash[0x16] = ctx->hash[0xe] << 0x27 | ctx->hash[0xe] >> 0x19;
    ctx->hash[0xe] = ctx->hash[0x14] << 0x12 | ctx->hash[0x14] >> 0x2e;
    ctx->hash[0x14] = ctx->hash[2] << 0x3e | ctx->hash[2] >> 2;
    ctx->hash[2] = ctx->hash[0xc] << 0x2b | ctx->hash[0xc] >> 0x15;
    ctx->hash[0xc] = ctx->hash[0xd] << 0x19 | ctx->hash[0xd] >> 0x27;
    ctx->hash[0xd] = ctx->hash[0x13] << 8 | ctx->hash[0x13] >> 0x38;
    ctx->hash[0x13] = ctx->hash[0x17] << 0x38 | ctx->hash[0x17] >> 8;
    ctx->hash[0x17] = ctx->hash[0xf] << 0x29 | ctx->hash[0xf] >> 0x17;
    ctx->hash[0xf] = ctx->hash[4] << 0x1b | ctx->hash[4] >> 0x25;
    ctx->hash[4] = ctx->hash[0x18] << 0xe | ctx->hash[0x18] >> 0x32;
    ctx->hash[0x18] = ctx->hash[0x15] << 2 | ctx->hash[0x15] >> 0x3e;
    ctx->hash[0x15] = ctx->hash[8] << 0x37 | ctx->hash[8] >> 9;
    ctx->hash[8] = ctx->hash[0x10] << 0x2d | ctx->hash[0x10] >> 0x13;
    ctx->hash[0x10] = ctx->hash[5] << 0x24 | ctx->hash[5] >> 0x1c;
    ctx->hash[5] = ctx->hash[3] << 0x1c | ctx->hash[3] >> 0x24;
    ctx->hash[3] = ctx->hash[0x12] << 0x15 | ctx->hash[0x12] >> 0x2b;
    ctx->hash[0x12] = ctx->hash[0x11] << 0xf | ctx->hash[0x11] >> 0x31;
    ctx->hash[0x11] = ctx->hash[0xb] << 10 | ctx->hash[0xb] >> 0x36;
    ctx->hash[0xb] = ctx->hash[7] << 6 | ctx->hash[7] >> 0x3a;
    ctx->hash[7] = ctx->hash[10] << 3 | ctx->hash[10] >> 0x3d;
    ctx->hash[10] = pVar3 << 1 | (ulong)((long)pVar3 < 0);
    uVar10 = 0xfffffffffffffffb;
    do {
      uVar4 = ctx->hash[uVar10 + 5];
      uVar5 = ctx->hash[uVar10 + 6];
      uVar6 = ctx->hash[uVar10 + 7];
      ctx->hash[uVar10 + 5] = ~uVar5 & uVar6 ^ uVar4;
      uVar7 = ctx->hash[uVar10 + 8];
      ctx->hash[uVar10 + 6] = ~uVar6 & uVar7 ^ uVar5;
      uVar8 = ctx->hash[uVar10 + 9];
      ctx->hash[uVar10 + 7] = ~uVar7 & uVar8 ^ uVar6;
      ctx->hash[uVar10 + 8] = ~uVar8 & uVar4 ^ uVar7;
      ctx->hash[uVar10 + 9] = ~uVar4 & uVar5 ^ uVar8;
      uVar10 = uVar10 + 5;
    } while (uVar10 < 0x14);
    ctx->hash[0] = ctx->hash[0] ^ pp_crypto_hash_sha3_K[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x18);
  return;
}

Assistant:

static void
pp_crypto_hash_sha3_process (PHashSHA3		*ctx,
			     const puint64	*data)
{
	puint i;
	puint qwords = ctx->block_size / 8;

	for (i = 0; i < qwords; ++i)
		ctx->hash[i] ^= data[i];

	/* Make the Keccak permutation */
	pp_crypto_hash_sha3_keccak_permutate (ctx);
}